

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_reference.c
# Opt level: O0

bool_t prf_external_reference_save_f(prf_node_t *node,prf_state_t *state,bfile_t *bfile)

{
  bfile_t *in_RDX;
  ushort *in_RDI;
  bfile_t *unaff_retaddr;
  node_data_conflict *data;
  int pos;
  int32_t in_stack_ffffffffffffffcc;
  bfile_t *in_stack_ffffffffffffffd0;
  bfile_t *bfile_00;
  int iVar1;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  bool_t bVar2;
  
  if (*in_RDI == prf_external_reference_info.opcode) {
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    bf_put_uint16_be(in_stack_ffffffffffffffd0,(uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    iVar1 = 4;
    bfile_00 = *(bfile_t **)(in_RDI + 4);
    bf_write(unaff_retaddr,(uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
             (uint)((ulong)in_RDI >> 0x20));
    iVar1 = iVar1 + 200;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar1 >> 0x18));
    iVar1 = iVar1 + 1;
    bf_put_int8(in_RDX,(int8_t)((uint)iVar1 >> 0x18));
    iVar1 = iVar1 + 1;
    bf_put_int16_be(bfile_00,(int16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    iVar1 = iVar1 + 2;
    bf_put_int16_be(bfile_00,(int16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    iVar1 = iVar1 + 2;
    bf_put_int32_be(bfile_00,in_stack_ffffffffffffffcc);
    if (iVar1 + 4 < (int)(uint)in_RDI[1]) {
      bf_write(unaff_retaddr,
               (uint8_t *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
               (uint)((ulong)in_RDI >> 0x20));
    }
    bVar2 = 1;
  }
  else {
    prf_error(9,"tried external reference save method on node of type %d.",(ulong)*in_RDI);
    bVar2 = 0;
  }
  return bVar2;
}

Assistant:

static bool_t
prf_external_reference_save_f(prf_node_t * node,
                              prf_state_t * state,
                              bfile_t * bfile)
{
  int pos;

  assert(node != NULL && bfile != NULL);

  if (node->opcode != prf_external_reference_info.opcode) {
    prf_error(9, "tried external reference save method on node of type %d.",
              node->opcode);
    return FALSE;
  }

  bf_put_uint16_be(bfile, node->opcode);
  bf_put_uint16_be(bfile, node->length);

  pos = 4;
  do {
    node_data * data;
    data = (node_data *) node->data;

    bf_write(bfile, data->filename, 200); pos += 200;
    bf_put_int8(bfile, data->reserved1); pos += 1;
    bf_put_int8(bfile, data->reserved2); pos += 1;
    bf_put_int16_be(bfile, data->reserved3[0]); pos += 2;
    bf_put_int16_be(bfile, data->reserved3[1]); pos += 2;
    bf_put_int32_be(bfile, data->flags); pos += 4;
  } while (FALSE);

  if (node->length > pos)
    pos += bf_write(bfile, node->data + pos - 4 + NODE_DATA_PAD,
                    node->length - pos);

  return TRUE;
}